

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcList.c
# Opt level: O3

void Mvc_CoverList2Array(Mvc_Cover_t *pCover)

{
  int iVar1;
  Mvc_Cube_t *pMVar2;
  long lVar3;
  
  Mvc_CoverAllocateArrayCubes(pCover);
  lVar3 = 0;
  for (pMVar2 = (pCover->lCubes).pHead; pMVar2 != (Mvc_Cube_t *)0x0; pMVar2 = pMVar2->pNext) {
    pCover->pCubes[lVar3] = pMVar2;
    lVar3 = lVar3 + 1;
  }
  iVar1 = Mvc_CoverReadCubeNum(pCover);
  if ((int)lVar3 == iVar1) {
    return;
  }
  __assert_fail("Counter == Mvc_CoverReadCubeNum(pCover)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/mvc/mvcList.c"
                ,0x128,"void Mvc_CoverList2Array(Mvc_Cover_t *)");
}

Assistant:

void Mvc_CoverList2Array( Mvc_Cover_t * pCover )
{
    Mvc_Cube_t * pCube;
    int Counter;
    // resize storage if necessary
    Mvc_CoverAllocateArrayCubes( pCover );
    // iterate through the cubes
    Counter = 0;
    Mvc_CoverForEachCube( pCover, pCube )
        pCover->pCubes[ Counter++ ] = pCube;
    assert( Counter == Mvc_CoverReadCubeNum(pCover) );
}